

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::instrumentFuncs(Instrumenter *this)

{
  StorageKind SVar1;
  pointer puVar2;
  size_t sVar3;
  char *pcVar4;
  Function *pFVar5;
  Name memory;
  undefined4 *puVar6;
  undefined4 *puVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Block *pBVar10;
  pointer puVar11;
  Const *pCVar12;
  Const *value;
  Store *first;
  Type TVar13;
  Function *pFVar14;
  Fatal *this_00;
  Address offset;
  pointer puVar15;
  iterator __begin2;
  Memory *pMVar16;
  undefined1 auStack_208 [8];
  Name memoryName;
  char *local_80;
  char *command;
  char *local_70;
  pointer local_68;
  Instrumenter *local_60;
  char *local_58;
  char *pcStack_50;
  pointer local_48;
  Function *local_40;
  Builder local_38;
  Builder builder;
  
  local_38.wasm = this->wasm;
  SVar1 = this->config->storageKind;
  if (SVar1 - InMemory < 2) {
    if ((((local_38.wasm)->features).features & 1) == 0) {
      local_80 = "--in-secondary-memory";
      if (SVar1 == InMemory) {
        local_80 = "--in-memory";
      }
      local_80 = local_80 + 2;
      Fatal::Fatal((Fatal *)auStack_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&memoryName.super_IString.str._M_str,"error: --",9);
      this_00 = Fatal::operator<<((Fatal *)auStack_208,&local_80);
      Fatal::operator<<(this_00,(char (*) [32])" requires atomics to be enabled");
      Fatal::~Fatal((Fatal *)auStack_208);
    }
    puVar2 = ((local_38.wasm)->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar2 == ((local_38.wasm)->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!wasm->memories.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/instrumenter.cpp"
                    ,0x8d,"void wasm::Instrumenter::instrumentFuncs()");
    }
    if (SVar1 == InMemory) {
      pMVar16 = (puVar2->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    }
    else {
      pMVar16 = (Memory *)&this->secondaryMemory;
    }
    auStack_208 = *(undefined1 (*) [8])&(pMVar16->super_Importable).super_Named.name;
    memoryName.super_IString.str._M_len =
         *(size_t *)((long)&(pMVar16->super_Importable).super_Named.name + 8);
    puVar15 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar14 = (Function *)
              ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((Function *)puVar15 != pFVar14) {
      offset.addr = 0;
      local_40 = pFVar14;
      do {
        pFVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar5->super_Importable).module + 8) == (char *)0x0) {
          local_48 = (pointer)offset.addr;
          pCVar12 = Builder::makeConstPtr(&local_38,0,(Type)0x2);
          value = Builder::makeConst<unsigned_int>(&local_38,1);
          memory.super_IString.str._M_str = (char *)memoryName.super_IString.str._M_len;
          memory.super_IString.str._M_len = (size_t)auStack_208;
          first = Builder::makeStore(&local_38,1,offset,1,(Expression *)pCVar12,(Expression *)value,
                                     (Type)0x2,memory);
          first->isAtomic = true;
          pEVar8 = pFVar5->body;
          TVar13.id = (uintptr_t)Builder::makeBlock(&local_38,(Expression *)first);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (TVar13.id + 0x20),pEVar8);
          wasm::Block::finalize(TVar13);
          pFVar5->body = (Expression *)TVar13.id;
          offset.addr = (address64_t)((int)local_48 + 1);
          pFVar14 = local_40;
        }
        puVar15 = puVar15 + 1;
      } while ((Function *)puVar15 != pFVar14);
    }
  }
  else if (SVar1 == InGlobals) {
    puVar15 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = ((local_38.wasm)->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar11) {
      local_48 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_68 = puVar11;
      local_60 = this;
      do {
        local_40 = (puVar15->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(local_40->super_Importable).module + 8) == (char *)0x0) {
          local_58 = (char *)(local_48->super_IString).str._M_len;
          pcStack_50 = (local_48->super_IString).str._M_str;
          puVar6 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar6 = 10;
          *(char **)(puVar6 + 4) = local_58;
          *(char **)(puVar6 + 6) = pcStack_50;
          *(undefined8 *)(puVar6 + 2) = 2;
          command = (char *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          command[0] = '\x0f';
          command[1] = '\0';
          command[2] = '\0';
          command[3] = '\0';
          command[8] = '\0';
          command[9] = '\0';
          command[10] = '\0';
          command[0xb] = '\0';
          command[0xc] = '\0';
          command[0xd] = '\0';
          command[0xe] = '\0';
          command[0xf] = '\0';
          command[0x10] = '\x14';
          command[0x11] = '\0';
          command[0x12] = '\0';
          command[0x13] = '\0';
          *(undefined4 **)(command + 0x18) = puVar6;
          wasm::Unary::finalize();
          sVar3 = (this->counterGlobal).super_IString.str._M_len;
          pcVar4 = (this->counterGlobal).super_IString.str._M_str;
          puVar6 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar6 = 10;
          *(size_t *)(puVar6 + 4) = sVar3;
          *(char **)(puVar6 + 6) = pcVar4;
          *(undefined8 *)(puVar6 + 2) = 2;
          local_58 = pcVar4;
          wasm::Literal::makeOne((Type)auStack_208);
          pCVar12 = Builder::makeConst(&local_38,(Literal *)auStack_208);
          puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          *puVar7 = 0x10;
          *(undefined8 *)(puVar7 + 2) = 0;
          puVar7[4] = 0;
          *(undefined4 **)(puVar7 + 6) = puVar6;
          *(Const **)(puVar7 + 8) = pCVar12;
          wasm::Binary::finalize();
          pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar8->_id = GlobalSetId;
          (pEVar8->type).id = 0;
          *(size_t *)(pEVar8 + 1) = sVar3;
          pEVar8[1].type.id = (uintptr_t)local_58;
          *(undefined4 **)(pEVar8 + 2) = puVar7;
          wasm::GlobalSet::finalize();
          local_58 = (char *)(local_48->super_IString).str._M_len;
          local_70 = (local_48->super_IString).str._M_str;
          sVar3 = (local_60->counterGlobal).super_IString.str._M_len;
          pcVar4 = (local_60->counterGlobal).super_IString.str._M_str;
          puVar6 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          *puVar6 = 10;
          *(size_t *)(puVar6 + 4) = sVar3;
          *(char **)(puVar6 + 6) = pcVar4;
          *(undefined8 *)(puVar6 + 2) = 2;
          pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar9->_id = GlobalSetId;
          (pEVar9->type).id = 0;
          *(char **)(pEVar9 + 1) = local_58;
          pEVar9[1].type.id = (uintptr_t)local_70;
          *(undefined4 **)(pEVar9 + 2) = puVar6;
          wasm::GlobalSet::finalize();
          pBVar10 = Builder::makeBlock(&local_38,pEVar8);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar10->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar9);
          wasm::Block::finalize();
          pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          pEVar9->_id = IfId;
          (pEVar9->type).id = 0;
          *(char **)(pEVar9 + 1) = command;
          pEVar9[1].type.id = (uintptr_t)pBVar10;
          *(undefined8 *)(pEVar9 + 2) = 0;
          wasm::If::finalize();
          pEVar8 = local_40->body;
          TVar13.id = (uintptr_t)Builder::makeBlock(&local_38,pEVar9);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (TVar13.id + 0x20),pEVar8);
          wasm::Block::finalize(TVar13);
          local_40->body = (Expression *)TVar13.id;
          wasm::Literal::~Literal((Literal *)auStack_208);
          local_48 = local_48 + 1;
          puVar11 = local_68;
          this = local_60;
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar11);
    }
  }
  return;
}

Assistant:

void Instrumenter::instrumentFuncs() {
  // Inject code at the beginning of each function to advance the monotonic
  // counter and set the function's timestamp if it hasn't already been set.
  Builder builder(*wasm);
  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      // (if (i32.eqz (global.get $timestamp))
      //   (block
      //     (global.set $monotonic_counter
      //       (i32.add
      //         (global.get $monotonic_counter)
      //         (i32.const 1)
      //       )
      //     )
      //     (global.set $timestamp
      //       (global.get $monotonic_counter)
      //     )
      //   )
      // )
      auto globalIt = functionGlobals.begin();
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeIf(
            builder.makeUnary(EqZInt32,
                              builder.makeGlobalGet(*globalIt, Type::i32)),
            builder.makeSequence(
              builder.makeGlobalSet(
                counterGlobal,
                builder.makeBinary(
                  AddInt32,
                  builder.makeGlobalGet(counterGlobal, Type::i32),
                  builder.makeConst(Literal::makeOne(Type::i32)))),
              builder.makeGlobalSet(
                *globalIt, builder.makeGlobalGet(counterGlobal, Type::i32)))),
          func->body,
          func->body->type);
        ++globalIt;
      });
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      if (!wasm->features.hasAtomics()) {
        const char* command =
          config.storageKind == WasmSplitOptions::StorageKind::InMemory
            ? "in-memory"
            : "in-secondary-memory";
        Fatal() << "error: --" << command << " requires atomics to be enabled";
      }
      // (i32.atomic.store8 offset=funcidx (i32.const 0) (i32.const 1))
      Index funcIdx = 0;
      assert(!wasm->memories.empty());
      Name memoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeAtomicStore(1,
                                  funcIdx,
                                  builder.makeConstPtr(0, Type::i32),
                                  builder.makeConst(uint32_t(1)),
                                  Type::i32,
                                  memoryName),
          func->body,
          func->body->type);
        ++funcIdx;
      });
      break;
    }
  }
}